

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  OssAdminCreateImgVpcRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_239;
  string local_238;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8;
  OssAdminBindBucketVipRequestType req;
  OssAdminBindBucketVipResponseType resp;
  undefined1 local_70 [24];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
  req.owner_id._M_string_length = 0;
  req.owner_id.field_2._M_local_buf[0] = '\0';
  paVar1 = &req.resource_owner_account.field_2;
  req.resource_owner_account._M_string_length = 0;
  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
  paVar2 = &req.resource_owner_id.field_2;
  req.resource_owner_id._M_string_length = 0;
  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
  paVar3 = &req.owner_account.field_2;
  req.owner_account._M_string_length = 0;
  req.owner_account.field_2._M_local_buf[0] = '\0';
  paVar4 = &req.region.field_2;
  req.region._M_string_length = 0;
  req.region.field_2._M_local_buf[0] = '\0';
  req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
  req.vpc_id._M_string_length = 0;
  req.vpc_id.field_2._M_local_buf[0] = '\0';
  req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
  req.vip._M_string_length = 0;
  req.vip.field_2._M_local_buf[0] = '\0';
  req.bucket_name._M_dataplus._M_p = (pointer)&req.bucket_name.field_2;
  req.bucket_name._M_string_length = 0;
  req.bucket_name.field_2._M_local_buf[0] = '\0';
  resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
  resp.request_id._M_string_length = 0;
  resp.request_id.field_2._M_allocated_capacity =
       resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
  req.owner_account._M_dataplus._M_p = (pointer)paVar3;
  req.region._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"my_appid",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
  this = (OssAdminCreateImgVpcRequestType *)
         aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_1d8);
  if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
    std::__cxx11::string::~string((string *)&resp);
    aliyun::OssAdminBindBucketVipRequestType::~OssAdminBindBucketVipRequestType(&req);
    req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
    req.owner_id._M_string_length = 0;
    req.owner_id.field_2._M_local_buf[0] = '\0';
    req.resource_owner_account._M_string_length = 0;
    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
    req.resource_owner_id._M_string_length = 0;
    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
    req.owner_account._M_string_length = 0;
    req.owner_account.field_2._M_local_buf[0] = '\0';
    req.region._M_string_length = 0;
    req.region.field_2._M_local_buf[0] = '\0';
    req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
    req.vpc_id._M_string_length = 0;
    req.vpc_id.field_2._M_local_buf[0] = '\0';
    req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
    req.vip._M_string_length = 0;
    req.vip.field_2._M_local_buf[0] = '\0';
    req.bucket_name._M_dataplus._M_p = (pointer)&req.bucket_name.field_2;
    req.bucket_name._M_string_length = 0;
    resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
    resp.request_id._M_string_length = 0;
    resp.request_id.field_2._M_allocated_capacity =
         resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_70._0_8_ = 0;
    req.bucket_name.field_2._M_local_buf[0] = '\0';
    local_70[8] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
    req.owner_account._M_dataplus._M_p = (pointer)paVar3;
    req.region._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1f8,"my_appid",(allocator<char> *)&local_238);
    std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
    this = (OssAdminCreateImgVpcRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_1d8);
    if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
      aliyun::OssAdminCreateImgVpcResponseType::~OssAdminCreateImgVpcResponseType
                ((OssAdminCreateImgVpcResponseType *)&resp);
      aliyun::OssAdminCreateImgVpcRequestType::~OssAdminCreateImgVpcRequestType
                ((OssAdminCreateImgVpcRequestType *)&req);
      req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
      req.owner_id._M_string_length = 0;
      req.owner_id.field_2._M_local_buf[0] = '\0';
      req.resource_owner_account._M_string_length = 0;
      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
      req.resource_owner_id._M_string_length = 0;
      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
      req.owner_account._M_string_length = 0;
      req.owner_account.field_2._M_local_buf[0] = '\0';
      req.region._M_string_length = 0;
      req.region.field_2._M_local_buf[0] = '\0';
      req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
      req.vpc_id._M_string_length = 0;
      req.vpc_id.field_2._M_local_buf[0] = '\0';
      req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
      req.vip._M_string_length = 0;
      req.vip.field_2._M_local_buf[0] = '\0';
      req.bucket_name._M_dataplus._M_p = (pointer)&req.bucket_name.field_2;
      req.bucket_name._M_string_length = 0;
      resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
      resp.request_id._M_string_length = 0;
      resp.request_id.field_2._M_allocated_capacity =
           resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_70._0_8_ = 0;
      req.bucket_name.field_2._M_local_buf[0] = '\0';
      local_70[8] = '\0';
      local_58._M_p = (pointer)&local_48;
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
      req.owner_account._M_dataplus._M_p = (pointer)paVar3;
      req.region._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::string<std::allocator<char>>
                (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1f8,"my_appid",(allocator<char> *)&local_238);
      std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
      this = (OssAdminCreateImgVpcRequestType *)
             aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_1d8);
      if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
        aliyun::OssAdminCreateOssVpcResponseType::~OssAdminCreateOssVpcResponseType
                  ((OssAdminCreateOssVpcResponseType *)&resp);
        aliyun::OssAdminCreateOssVpcRequestType::~OssAdminCreateOssVpcRequestType
                  ((OssAdminCreateOssVpcRequestType *)&req);
        req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
        req.owner_id._M_string_length = 0;
        req.owner_id.field_2._M_local_buf[0] = '\0';
        req.resource_owner_account._M_string_length = 0;
        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
        req.resource_owner_id._M_string_length = 0;
        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
        req.owner_account._M_string_length = 0;
        req.owner_account.field_2._M_local_buf[0] = '\0';
        req.region._M_string_length = 0;
        req.region.field_2._M_local_buf[0] = '\0';
        req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
        req.vpc_id._M_string_length = 0;
        req.vpc_id.field_2._M_local_buf[0] = '\0';
        req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
        req.vip._M_string_length = 0;
        req.vip.field_2._M_local_buf[0] = '\0';
        resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
        resp.request_id._M_string_length = 0;
        resp.request_id.field_2._M_allocated_capacity =
             resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
        req.owner_account._M_dataplus._M_p = (pointer)paVar3;
        req.region._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1f8,"my_appid",(allocator<char> *)&local_238);
        std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
        this = (OssAdminCreateImgVpcRequestType *)
               aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
        std::__cxx11::string::~string(local_218);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::string::~string(local_1d8);
        if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
          std::__cxx11::string::~string((string *)&resp);
          aliyun::OssAdminDeleteImgVpcRequestType::~OssAdminDeleteImgVpcRequestType
                    ((OssAdminDeleteImgVpcRequestType *)&req);
          req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
          req.owner_id._M_string_length = 0;
          req.owner_id.field_2._M_local_buf[0] = '\0';
          req.resource_owner_account._M_string_length = 0;
          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
          req.resource_owner_id._M_string_length = 0;
          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
          req.owner_account._M_string_length = 0;
          req.owner_account.field_2._M_local_buf[0] = '\0';
          req.region._M_string_length = 0;
          req.region.field_2._M_local_buf[0] = '\0';
          req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
          req.vpc_id._M_string_length = 0;
          req.vpc_id.field_2._M_local_buf[0] = '\0';
          req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
          req.vip._M_string_length = 0;
          req.vip.field_2._M_local_buf[0] = '\0';
          resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
          resp.request_id._M_string_length = 0;
          resp.request_id.field_2._M_allocated_capacity =
               resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
          req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
          req.owner_account._M_dataplus._M_p = (pointer)paVar3;
          req.region._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1f8,"my_appid",(allocator<char> *)&local_238);
          std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
          this = (OssAdminCreateImgVpcRequestType *)
                 aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
          std::__cxx11::string::~string(local_218);
          std::__cxx11::string::~string(local_1f8);
          std::__cxx11::string::~string(local_1d8);
          if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
            std::__cxx11::string::~string((string *)&resp);
            aliyun::OssAdminDeleteOssVpcRequestType::~OssAdminDeleteOssVpcRequestType
                      ((OssAdminDeleteOssVpcRequestType *)&req);
            req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
            req.owner_id._M_string_length = 0;
            req.owner_id.field_2._M_local_buf[0] = '\0';
            req.resource_owner_account._M_string_length = 0;
            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
            req.resource_owner_id._M_string_length = 0;
            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
            req.owner_account._M_string_length = 0;
            req.owner_account.field_2._M_local_buf[0] = '\0';
            req.region._M_string_length = 0;
            req.region.field_2._M_local_buf[0] = '\0';
            resp.request_id.field_2._M_allocated_capacity = 0;
            resp.request_id._M_dataplus._M_p = (pointer)0x0;
            resp.request_id._M_string_length = 0;
            resp.request_id.field_2._8_8_ = local_70;
            local_70._0_8_ = local_70._0_8_ & 0xffffffffffffff00;
            req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
            req.owner_account._M_dataplus._M_p = (pointer)paVar3;
            req.region._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1f8,"my_appid",(allocator<char> *)&local_238);
            std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
            this = (OssAdminCreateImgVpcRequestType *)
                   aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
            std::__cxx11::string::~string(local_218);
            std::__cxx11::string::~string(local_1f8);
            std::__cxx11::string::~string(local_1d8);
            if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
              aliyun::OssAdminGetBucketVipsResponseType::~OssAdminGetBucketVipsResponseType
                        ((OssAdminGetBucketVipsResponseType *)&resp);
              aliyun::OssAdminGetBucketVipsRequestType::~OssAdminGetBucketVipsRequestType
                        ((OssAdminGetBucketVipsRequestType *)&req);
              req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
              req.owner_id._M_string_length = 0;
              req.owner_id.field_2._M_local_buf[0] = '\0';
              req.resource_owner_account._M_string_length = 0;
              req.resource_owner_account.field_2._M_local_buf[0] = '\0';
              req.resource_owner_id._M_string_length = 0;
              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
              req.owner_account._M_string_length = 0;
              req.owner_account.field_2._M_local_buf[0] = '\0';
              req.region._M_string_length = 0;
              req.region.field_2._M_local_buf[0] = '\0';
              req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
              req.vpc_id._M_string_length = 0;
              req.vpc_id.field_2._M_local_buf[0] = '\0';
              req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
              req.vip._M_string_length = 0;
              resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
              resp.request_id._M_string_length = 0;
              resp.request_id.field_2._M_allocated_capacity =
                   resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_70._0_8_ = 0;
              req.vip.field_2._M_local_buf[0] = '\0';
              local_70[8] = '\0';
              local_58._M_p = (pointer)&local_48;
              local_50 = 0;
              local_48._M_local_buf[0] = '\0';
              req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
              req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
              req.owner_account._M_dataplus._M_p = (pointer)paVar3;
              req.region._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1f8,"my_appid",(allocator<char> *)&local_238);
              std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239);
              this = (OssAdminCreateImgVpcRequestType *)
                     aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
              std::__cxx11::string::~string(local_218);
              std::__cxx11::string::~string(local_1f8);
              std::__cxx11::string::~string(local_1d8);
              if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
                aliyun::OssAdminGetImgVpcInfoResponseType::~OssAdminGetImgVpcInfoResponseType
                          ((OssAdminGetImgVpcInfoResponseType *)&resp);
                aliyun::OssAdminGetImgVpcInfoRequestType::~OssAdminGetImgVpcInfoRequestType
                          ((OssAdminGetImgVpcInfoRequestType *)&req);
                req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
                req.owner_id._M_string_length = 0;
                req.owner_id.field_2._M_local_buf[0] = '\0';
                req.resource_owner_account._M_string_length = 0;
                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                req.resource_owner_id._M_string_length = 0;
                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                req.owner_account._M_string_length = 0;
                req.owner_account.field_2._M_local_buf[0] = '\0';
                req.region._M_string_length = 0;
                req.region.field_2._M_local_buf[0] = '\0';
                req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
                req.vpc_id._M_string_length = 0;
                req.vpc_id.field_2._M_local_buf[0] = '\0';
                req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
                req.vip._M_string_length = 0;
                resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
                resp.request_id._M_string_length = 0;
                resp.request_id.field_2._M_allocated_capacity =
                     resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_70._0_8_ = 0;
                req.vip.field_2._M_local_buf[0] = '\0';
                local_70[8] = '\0';
                local_58._M_p = (pointer)&local_48;
                local_50 = 0;
                local_48._M_local_buf[0] = '\0';
                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
                req.owner_account._M_dataplus._M_p = (pointer)paVar3;
                req.region._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::string<std::allocator<char>>
                          (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_1f8,"my_appid",(allocator<char> *)&local_238);
                std::__cxx11::string::string<std::allocator<char>>(local_218,"my_secret",&local_239)
                ;
                this = (OssAdminCreateImgVpcRequestType *)
                       aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
                std::__cxx11::string::~string(local_218);
                std::__cxx11::string::~string(local_1f8);
                std::__cxx11::string::~string(local_1d8);
                if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
                  aliyun::OssAdminGetOssVpcInfoResponseType::~OssAdminGetOssVpcInfoResponseType
                            ((OssAdminGetOssVpcInfoResponseType *)&resp);
                  aliyun::OssAdminGetOssVpcInfoRequestType::~OssAdminGetOssVpcInfoRequestType
                            ((OssAdminGetOssVpcInfoRequestType *)&req);
                  req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
                  req.owner_id._M_string_length = 0;
                  req.owner_id.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_account._M_string_length = 0;
                  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_id._M_string_length = 0;
                  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                  req.owner_account._M_string_length = 0;
                  req.owner_account.field_2._M_local_buf[0] = '\0';
                  req.region._M_string_length = 0;
                  req.region.field_2._M_local_buf[0] = '\0';
                  req.vpc_id._M_dataplus._M_p = (pointer)&req.vpc_id.field_2;
                  req.vpc_id._M_string_length = 0;
                  req.vpc_id.field_2._M_local_buf[0] = '\0';
                  req.vip._M_dataplus._M_p = (pointer)&req.vip.field_2;
                  req.vip._M_string_length = 0;
                  req.vip.field_2._M_local_buf[0] = '\0';
                  req.bucket_name._M_dataplus._M_p = (pointer)&req.bucket_name.field_2;
                  req.bucket_name._M_string_length = 0;
                  req.bucket_name.field_2._M_local_buf[0] = '\0';
                  resp.request_id._M_dataplus._M_p = (pointer)&resp.request_id.field_2;
                  resp.request_id._M_string_length = 0;
                  resp.request_id.field_2._M_allocated_capacity =
                       resp.request_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar1;
                  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar2;
                  req.owner_account._M_dataplus._M_p = (pointer)paVar3;
                  req.region._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_1d8,"cn-hangzhou",(allocator<char> *)&local_1b8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_1f8,"my_appid",(allocator<char> *)&local_238);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_218,"my_secret",&local_239);
                  this = (OssAdminCreateImgVpcRequestType *)
                         aliyun::OssAdmin::CreateOssAdminClient(local_1d8,local_1f8,local_218);
                  std::__cxx11::string::~string(local_218);
                  std::__cxx11::string::~string(local_1f8);
                  std::__cxx11::string::~string(local_1d8);
                  if (this == (OssAdminCreateImgVpcRequestType *)0x0) {
                    std::__cxx11::string::~string((string *)&resp);
                    aliyun::OssAdminUnBindBucketVipRequestType::~OssAdminUnBindBucketVipRequestType
                              ((OssAdminUnBindBucketVipRequestType *)&req);
                    return 0;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
                  aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
                  std::__cxx11::string::~string((string *)&local_1b8);
                  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_238,"{  \"requestId\": \"requestId\"}",&local_239);
                  HttpTestListener::SetResponseBody(this_00,&local_238);
                  std::__cxx11::string::~string((string *)&local_238);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                  std::__cxx11::string::assign((char *)&req.owner_account);
                  std::__cxx11::string::assign((char *)&req.region);
                  std::__cxx11::string::assign((char *)&req.vpc_id);
                  std::__cxx11::string::assign((char *)&req.vip);
                  std::__cxx11::string::assign((char *)&req.bucket_name);
                  aliyun::OssAdmin::UnBindBucketVip
                            ((OssAdminUnBindBucketVipRequestType *)this,
                             (OssAdminUnBindBucketVipResponseType *)&req,(OssAdminErrorInfo *)&resp)
                  ;
                  HttpTestListener::WaitComplete(this_00);
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
                  aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
                  std::__cxx11::string::~string((string *)&local_1b8);
                  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_238,
                             "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}"
                             ,&local_239);
                  HttpTestListener::SetResponseBody(this_00,&local_238);
                  std::__cxx11::string::~string((string *)&local_238);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                  std::__cxx11::string::assign((char *)&req.owner_account);
                  std::__cxx11::string::assign((char *)&req.region);
                  std::__cxx11::string::assign((char *)&req.vpc_id);
                  std::__cxx11::string::assign((char *)&req.vip);
                  aliyun::OssAdmin::GetOssVpcInfo
                            ((OssAdminGetOssVpcInfoRequestType *)this,
                             (OssAdminGetOssVpcInfoResponseType *)&req,(OssAdminErrorInfo *)&resp);
                  HttpTestListener::WaitComplete(this_00);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
                aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
                std::__cxx11::string::~string((string *)&local_1b8);
                if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_238,
                           "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}"
                           ,&local_239);
                HttpTestListener::SetResponseBody(this_00,&local_238);
                std::__cxx11::string::~string((string *)&local_238);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req);
                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                std::__cxx11::string::assign((char *)&req.owner_account);
                std::__cxx11::string::assign((char *)&req.region);
                std::__cxx11::string::assign((char *)&req.vpc_id);
                std::__cxx11::string::assign((char *)&req.vip);
                aliyun::OssAdmin::GetImgVpcInfo
                          ((OssAdminGetImgVpcInfoRequestType *)this,
                           (OssAdminGetImgVpcInfoResponseType *)&req,(OssAdminErrorInfo *)&resp);
                HttpTestListener::WaitComplete(this_00);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
              aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
              std::__cxx11::string::~string((string *)&local_1b8);
              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_238,
                         "{  \"vipList\": {    \"vip\": [      \"vip\"    ]  },  \"requestId\": \"requestId\"}"
                         ,&local_239);
              HttpTestListener::SetResponseBody(this_00,&local_238);
              std::__cxx11::string::~string((string *)&local_238);
              HttpTestListener::Start(this_00);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&req.resource_owner_account);
              std::__cxx11::string::assign((char *)&req.resource_owner_id);
              std::__cxx11::string::assign((char *)&req.owner_account);
              std::__cxx11::string::assign((char *)&req.region);
              aliyun::OssAdmin::GetBucketVips
                        ((OssAdminGetBucketVipsRequestType *)this,
                         (OssAdminGetBucketVipsResponseType *)&req,(OssAdminErrorInfo *)&resp);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
            aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
            std::__cxx11::string::~string((string *)&local_1b8);
            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_238,"{  \"requestId\": \"requestId\"}",&local_239);
            HttpTestListener::SetResponseBody(this_00,&local_238);
            std::__cxx11::string::~string((string *)&local_238);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            std::__cxx11::string::assign((char *)&req.resource_owner_account);
            std::__cxx11::string::assign((char *)&req.resource_owner_id);
            std::__cxx11::string::assign((char *)&req.owner_account);
            std::__cxx11::string::assign((char *)&req.region);
            std::__cxx11::string::assign((char *)&req.vpc_id);
            std::__cxx11::string::assign((char *)&req.vip);
            aliyun::OssAdmin::DeleteOssVpc
                      ((OssAdminDeleteOssVpcRequestType *)this,
                       (OssAdminDeleteOssVpcResponseType *)&req,(OssAdminErrorInfo *)&resp);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
          aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"{  \"requestId\": \"requestId\"}",&local_239);
          HttpTestListener::SetResponseBody(this_00,&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&req);
          std::__cxx11::string::assign((char *)&req.resource_owner_account);
          std::__cxx11::string::assign((char *)&req.resource_owner_id);
          std::__cxx11::string::assign((char *)&req.owner_account);
          std::__cxx11::string::assign((char *)&req.region);
          std::__cxx11::string::assign((char *)&req.vpc_id);
          std::__cxx11::string::assign((char *)&req.vip);
          aliyun::OssAdmin::DeleteImgVpc
                    ((OssAdminDeleteImgVpcRequestType *)this,
                     (OssAdminDeleteImgVpcResponseType *)&req,(OssAdminErrorInfo *)&resp);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
        aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        if ((char)(((OssAdminCreateOssVpcRequestType *)this)->resource_owner_account).
                  _M_string_length == '\x01') {
          *(undefined1 *)
           ((long)&(((OssAdminCreateOssVpcRequestType *)this)->resource_owner_account).
                   _M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,
                   "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}",
                   &local_239);
        HttpTestListener::SetResponseBody(this_00,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&req.resource_owner_account);
        std::__cxx11::string::assign((char *)&req.resource_owner_id);
        std::__cxx11::string::assign((char *)&req.owner_account);
        std::__cxx11::string::assign((char *)&req.region);
        std::__cxx11::string::assign((char *)&req.vpc_id);
        std::__cxx11::string::assign((char *)&req.vip);
        std::__cxx11::string::assign((char *)&req.bucket_name);
        aliyun::OssAdmin::CreateOssVpc
                  ((OssAdminCreateOssVpcRequestType *)this,(OssAdminCreateOssVpcResponseType *)&req,
                   (OssAdminErrorInfo *)&resp);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
      aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,
                 "{  \"requestId\": \"requestId\",  \"vip\": \"vip\",  \"vpcId\": \"vpcId\"}",
                 &local_239);
      HttpTestListener::SetResponseBody(this_00,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.resource_owner_account);
      std::__cxx11::string::assign((char *)&req.resource_owner_id);
      std::__cxx11::string::assign((char *)&req.owner_account);
      std::__cxx11::string::assign((char *)&req.region);
      std::__cxx11::string::assign((char *)&req.vpc_id);
      std::__cxx11::string::assign((char *)&req.vip);
      std::__cxx11::string::assign((char *)&req.bucket_name);
      aliyun::OssAdmin::CreateImgVpc
                (this,(OssAdminCreateImgVpcResponseType *)&req,(OssAdminErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)&local_238);
    aliyun::OssAdmin::SetProxyHost((OssAdmin *)this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"{  \"requestId\": \"requestId\"}",&local_239);
    HttpTestListener::SetResponseBody(this_00,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.resource_owner_account);
    std::__cxx11::string::assign((char *)&req.resource_owner_id);
    std::__cxx11::string::assign((char *)&req.owner_account);
    std::__cxx11::string::assign((char *)&req.region);
    std::__cxx11::string::assign((char *)&req.vpc_id);
    std::__cxx11::string::assign((char *)&req.vip);
    std::__cxx11::string::assign((char *)&req.bucket_name);
    aliyun::OssAdmin::BindBucketVip
              ((OssAdminBindBucketVipRequestType *)this,(OssAdminBindBucketVipResponseType *)&req,
               (OssAdminErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::OssAdmin::~OssAdmin((OssAdmin *)this);
  operator_delete(this,0x38);
  std::__cxx11::string::~string((string *)&resp);
  aliyun::OssAdminUnBindBucketVipRequestType::~OssAdminUnBindBucketVipRequestType
            ((OssAdminUnBindBucketVipRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_bind_bucket_vip();
  test_create_img_vpc();
  test_create_oss_vpc();
  test_delete_img_vpc();
  test_delete_oss_vpc();
  test_get_bucket_vips();
  test_get_img_vpc_info();
  test_get_oss_vpc_info();
  test_un_bind_bucket_vip();
}